

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::NopImpliedFixture_nop_implied_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::NopImpliedFixture_nop_implied_Test> *this
          )

{
  CpuTest *this_00;
  
  WithParamInterface<unsigned_char>::parameter_ = &this->parameter_;
  this_00 = (CpuTest *)operator_new(0x120);
  n_e_s::core::test::CpuTest::CpuTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__NopImpliedFixture_002712c0;
  this_00[1].super_Test._vptr_Test = (_func_int **)&DAT_00271300;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }